

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

uint __thiscall
Assimp::StreamReader<false,_false>::SetReadLimit(StreamReader<false,_false> *this,uint _limit)

{
  int8_t *piVar1;
  runtime_error *this_00;
  int8_t *piVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  piVar1 = this->limit;
  if (_limit == 0xffffffff) {
    this->limit = this->end;
  }
  else {
    piVar2 = this->buffer + _limit;
    this->limit = piVar2;
    if (this->end < piVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"StreamReader: Invalid read limit","");
      std::runtime_error::runtime_error(this_00,(string *)local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (int)piVar1 - (int)this->buffer;
}

Assistant:

unsigned int GetReadLimit() const    {
        return (unsigned int)(limit - buffer);
    }